

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureFormatTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::TextureBufferFormatCase::init
          (TextureBufferFormatCase *this,EVP_PKEY_CTX *ctx)

{
  float fVar1;
  float fVar2;
  float fVar3;
  deUint32 internalFormat;
  bool bVar4;
  int iVar5;
  int iVar6;
  int extraout_EAX;
  TestLog *this_00;
  float *pfVar7;
  RenderContext *pRVar8;
  ContextInfo *pCVar9;
  NotSupportedError *pNVar10;
  MessageBuilder *pMVar11;
  TextureBuffer *this_01;
  Enum<int,_2UL> EVar12;
  PixelBufferAccess local_278;
  LogGradientFmt local_250;
  GetNameFunc local_240;
  int local_238;
  Enum<int,_2UL> local_230;
  MessageBuilder local_220;
  deUint32 local_8c;
  ContextType local_88;
  undefined1 local_81;
  undefined1 local_80 [7];
  bool supportsES32;
  Vec4 colorB;
  Vec4 colorA;
  TextureFormatInfo spec;
  TextureFormat fmt;
  TestLog *log;
  TextureBufferFormatCase *this_local;
  
  this_00 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)
  ;
  spec.lookupBias.m_data._8_8_ = glu::mapGLInternalFormat(this->m_format);
  tcu::getTextureFormatInfo
            ((TextureFormatInfo *)(colorA.m_data + 2),(TextureFormat *)(spec.lookupBias.m_data + 2))
  ;
  pfVar7 = tcu::Vector<float,_4>::x((Vector<float,_4> *)(colorA.m_data + 2));
  fVar1 = *pfVar7;
  pfVar7 = tcu::Vector<float,_4>::y((Vector<float,_4> *)(spec.valueMin.m_data + 2));
  fVar2 = *pfVar7;
  pfVar7 = tcu::Vector<float,_4>::z((Vector<float,_4> *)(colorA.m_data + 2));
  fVar3 = *pfVar7;
  pfVar7 = tcu::Vector<float,_4>::w((Vector<float,_4> *)(spec.valueMin.m_data + 2));
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(colorB.m_data + 2),fVar1,fVar2,fVar3,*pfVar7);
  pfVar7 = tcu::Vector<float,_4>::x((Vector<float,_4> *)(spec.valueMin.m_data + 2));
  fVar1 = *pfVar7;
  pfVar7 = tcu::Vector<float,_4>::y((Vector<float,_4> *)(colorA.m_data + 2));
  fVar2 = *pfVar7;
  pfVar7 = tcu::Vector<float,_4>::z((Vector<float,_4> *)(spec.valueMin.m_data + 2));
  fVar3 = *pfVar7;
  pfVar7 = tcu::Vector<float,_4>::w((Vector<float,_4> *)(colorA.m_data + 2));
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_80,fVar1,fVar2,fVar3,*pfVar7);
  pRVar8 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  local_88.super_ApiType.m_bits = (ApiType)(*pRVar8->_vptr_RenderContext[2])();
  local_8c = (deUint32)glu::ApiType::es(3,2);
  local_81 = glu::contextSupports(local_88,(ApiType)local_8c);
  if (!(bool)local_81) {
    pCVar9 = gles31::Context::getContextInfo((this->super_TestCase).m_context);
    bVar4 = glu::ContextInfo::isExtensionSupported(pCVar9,"GL_OES_texture_buffer");
    if (!bVar4) {
      pCVar9 = gles31::Context::getContextInfo((this->super_TestCase).m_context);
      bVar4 = glu::ContextInfo::isExtensionSupported(pCVar9,"GL_EXT_texture_buffer");
      if (!bVar4) {
        pNVar10 = (NotSupportedError *)__cxa_allocate_exception(0x38);
        tcu::NotSupportedError::NotSupportedError
                  (pNVar10,"Texture buffers not supported",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureFormatTests.cpp"
                   ,299);
        __cxa_throw(pNVar10,&tcu::NotSupportedError::typeinfo,
                    tcu::NotSupportedError::~NotSupportedError);
      }
    }
  }
  pCVar9 = gles31::Context::getContextInfo((this->super_TestCase).m_context);
  iVar5 = (*pCVar9->_vptr_ContextInfo[2])(pCVar9,0x8c2b);
  this->m_maxTextureBufferSize = iVar5;
  if (this->m_maxTextureBufferSize < 1) {
    pNVar10 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar10,"GL_MAX_TEXTURE_BUFFER_SIZE > 0 required",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureFormatTests.cpp"
               ,0x131);
    __cxa_throw(pNVar10,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  tcu::TestLog::operator<<(&local_220,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar11 = tcu::MessageBuilder::operator<<(&local_220,(char (*) [17])"Buffer texture, ");
  EVar12 = glu::getTextureFormatStr(this->m_format);
  local_240 = EVar12.m_getName;
  local_238 = EVar12.m_value;
  local_230.m_getName = local_240;
  local_230.m_value = local_238;
  pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_230);
  pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [3])0x2a4b1eb);
  pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&this->m_width);
  pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [15])",\n  fill with ");
  local_250 = glu::TextureTestUtil::formatGradient((Vec4 *)(colorB.m_data + 2),(Vec4 *)local_80);
  pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_250);
  pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [10])0x2b88192);
  tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_220);
  this_01 = (TextureBuffer *)operator_new(0x38);
  pRVar8 = this->m_renderCtx;
  internalFormat = this->m_format;
  iVar5 = this->m_width;
  iVar6 = tcu::TextureFormat::getPixelSize((TextureFormat *)(spec.lookupBias.m_data + 2));
  glu::TextureBuffer::TextureBuffer(this_01,pRVar8,internalFormat,(long)(iVar5 * iVar6));
  this->m_texture = this_01;
  glu::TextureBuffer::getFullRefTexture(&local_278,this->m_texture);
  tcu::fillWithComponentGradients(&local_278,(Vec4 *)(colorB.m_data + 2),(Vec4 *)local_80);
  return extraout_EAX;
}

Assistant:

void TextureBufferFormatCase::init (void)
{
	TestLog&				log				= m_testCtx.getLog();
	tcu::TextureFormat		fmt				= glu::mapGLInternalFormat(m_format);
	tcu::TextureFormatInfo	spec			= tcu::getTextureFormatInfo(fmt);
	tcu::Vec4				colorA			(spec.valueMin.x(), spec.valueMax.y(), spec.valueMin.z(), spec.valueMax.w());
	tcu::Vec4				colorB			(spec.valueMax.x(), spec.valueMin.y(), spec.valueMax.z(), spec.valueMin.w());
	const bool				supportsES32	= glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2));

	if (!supportsES32
		&& !m_context.getContextInfo().isExtensionSupported("GL_OES_texture_buffer")
		&& !m_context.getContextInfo().isExtensionSupported("GL_EXT_texture_buffer"))
	{
		TCU_THROW(NotSupportedError, "Texture buffers not supported");
	}

	m_maxTextureBufferSize = m_context.getContextInfo().getInt(GL_MAX_TEXTURE_BUFFER_SIZE);

	if (m_maxTextureBufferSize <= 0)
		TCU_THROW(NotSupportedError, "GL_MAX_TEXTURE_BUFFER_SIZE > 0 required");

	log << TestLog::Message << "Buffer texture, " << glu::getTextureFormatStr(m_format) << ", " << m_width
							<< ",\n  fill with " << formatGradient(&colorA, &colorB) << " gradient"
		<< TestLog::EndMessage;

	m_texture = new glu::TextureBuffer(m_renderCtx, m_format, m_width * fmt.getPixelSize());

	// Fill level 0.
	tcu::fillWithComponentGradients(m_texture->getFullRefTexture(), colorA, colorB);
}